

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFContext.cpp
# Opt level: O3

DWARFDebugNames * __thiscall llvm::DWARFContext::getDebugNames(DWARFContext *this)

{
  DWARFObject *pDVar1;
  undefined8 uVar2;
  size_t sVar3;
  SmallVectorImpl<llvm::DWARFDebugNames::NameIndex> *pSVar4;
  _func_int **pp_Var5;
  int iVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  DWARFDebugNames *pDVar9;
  ulong uVar10;
  size_t extraout_RDX;
  Error local_48;
  undefined1 local_40 [16];
  DWARFSection *pDVar8;
  
  pDVar1 = (this->DObj)._M_t.
           super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
           ._M_t.
           super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
           .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl;
  iVar6 = (*pDVar1->_vptr_DWARFObject[0x27])(pDVar1);
  pDVar8 = (DWARFSection *)CONCAT44(extraout_var,iVar6);
  iVar6 = (*((this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[0x11])();
  iVar7 = (*((this->DObj)._M_t.
             super___uniq_ptr_impl<const_llvm::DWARFObject,_std::default_delete<const_llvm::DWARFObject>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_llvm::DWARFObject_*,_std::default_delete<const_llvm::DWARFObject>_>
             .super__Head_base<0UL,_const_llvm::DWARFObject_*,_false>._M_head_impl)->
            _vptr_DWARFObject[5])();
  pDVar9 = (this->Names)._M_t.
           super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
           ._M_t.
           super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
           .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
  if (pDVar9 == (DWARFDebugNames *)0x0) {
    uVar2 = (pDVar8->Data).Data;
    sVar3 = (pDVar8->Data).Length;
    pDVar9 = (DWARFDebugNames *)operator_new(0x70);
    (pDVar9->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.Data = uVar2;
    (pDVar9->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.Data.Length = sVar3;
    (pDVar9->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.IsLittleEndian =
         (uint8_t)iVar7;
    (pDVar9->super_DWARFAcceleratorTable).AccelSection.super_DataExtractor.AddressSize = '\0';
    (pDVar9->super_DWARFAcceleratorTable).AccelSection.Obj = pDVar1;
    (pDVar9->super_DWARFAcceleratorTable).AccelSection.Section = pDVar8;
    (pDVar9->super_DWARFAcceleratorTable).StringSection.Data.Data =
         (char *)CONCAT44(extraout_var_00,iVar6);
    (pDVar9->super_DWARFAcceleratorTable).StringSection.Data.Length = extraout_RDX;
    (pDVar9->super_DWARFAcceleratorTable).StringSection.IsLittleEndian = (uint8_t)iVar7;
    (pDVar9->super_DWARFAcceleratorTable).StringSection.AddressSize = '\0';
    (pDVar9->super_DWARFAcceleratorTable)._vptr_DWARFAcceleratorTable =
         (_func_int **)&PTR__DWARFDebugNames_00d77758;
    *(DenseMap<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*,_llvm::DenseMapInfo<unsigned_long>,_llvm::detail::DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*>_>
      **)&(pDVar9->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>.
          super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false> =
         &pDVar9->CUToNameIndex;
    pSVar4 = &(pDVar9->NameIndices).super_SmallVectorImpl<llvm::DWARFDebugNames::NameIndex>;
    (pSVar4->super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>).
    super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase.
    Size = 0;
    (pSVar4->super_SmallVectorTemplateBase<llvm::DWARFDebugNames::NameIndex,_false>).
    super_SmallVectorTemplateCommon<llvm::DWARFDebugNames::NameIndex,_void>.super_SmallVectorBase.
    Capacity = 0;
    (pDVar9->CUToNameIndex).Buckets =
         (DenseMapPair<unsigned_long,_const_llvm::DWARFDebugNames::NameIndex_*> *)0x0;
    *(undefined8 *)((long)&(pDVar9->CUToNameIndex).Buckets + 4) = 0;
    (pDVar9->CUToNameIndex).NumTombstones = 0;
    (pDVar9->CUToNameIndex).NumBuckets = 0;
    (this->Names)._M_t.
    super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>._M_t.
    super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>.
    super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl = pDVar9;
    DWARFDebugNames::extract((DWARFDebugNames *)local_40);
    uVar10 = local_40._0_8_ & 0xfffffffffffffffe;
    pp_Var5 = (_func_int **)(uVar10 != 0 | uVar10);
    if (uVar10 != 0) {
      local_48.Payload = (ErrorInfoBase *)(local_40._0_8_ | 1);
      local_40._0_8_ = (_func_int **)0x0;
      handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
                (&local_48,(anon_class_1_0_00000001 *)(local_40 + 0xf));
      pp_Var5 = (_func_int **)local_40._0_8_;
      if ((long *)((ulong)local_48.Payload & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)((ulong)local_48.Payload & 0xfffffffffffffffe) + 8))();
        pp_Var5 = (_func_int **)local_40._0_8_;
      }
    }
    local_40._0_8_ = pp_Var5;
    if ((long *)(local_40._0_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_40._0_8_ & 0xfffffffffffffffe) + 8))();
    }
    pDVar9 = (this->Names)._M_t.
             super___uniq_ptr_impl<llvm::DWARFDebugNames,_std::default_delete<llvm::DWARFDebugNames>_>
             ._M_t.
             super__Tuple_impl<0UL,_llvm::DWARFDebugNames_*,_std::default_delete<llvm::DWARFDebugNames>_>
             .super__Head_base<0UL,_llvm::DWARFDebugNames_*,_false>._M_head_impl;
  }
  return pDVar9;
}

Assistant:

const DWARFDebugNames &DWARFContext::getDebugNames() {
  return getAccelTable(Names, *DObj, DObj->getNamesSection(),
                       DObj->getStrSection(), isLittleEndian());
}